

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O0

int SUNLinSol_SPFGMRSetGSType(SUNLinearSolver S,int gstype)

{
  int gstype_local;
  SUNLinearSolver S_local;
  
  if ((gstype == 1) || (gstype == 2)) {
    if (S == (SUNLinearSolver)0x0) {
      S_local._4_4_ = -1;
    }
    else {
      *(int *)((long)S->content + 8) = gstype;
      S_local._4_4_ = 0;
    }
  }
  else {
    S_local._4_4_ = -2;
  }
  return S_local._4_4_;
}

Assistant:

SUNDIALS_EXPORT int SUNLinSol_SPFGMRSetGSType(SUNLinearSolver S, int gstype)
{
  /* Check for legal gstype */ 
  if ((gstype != MODIFIED_GS) && (gstype != CLASSICAL_GS)) {
    return(SUNLS_ILL_INPUT);
  }

  /* Check for non-NULL SUNLinearSolver */
  if (S == NULL) return(SUNLS_MEM_NULL);

  /* Set pretype */
  SPFGMR_CONTENT(S)->gstype = gstype;
  return(SUNLS_SUCCESS);
}